

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

size_t tinyusdz::anon_unknown_0::_EncodeIntegers<int>(int *begin,size_t numInts,char *output)

{
  type_conflict7 tVar1;
  mapped_type *pmVar2;
  type local_bc;
  int *piStack_b8;
  SInt prevVal;
  int *cur;
  char *vintsOut;
  char *codesOut;
  char *p;
  size_t count;
  int *piStack_88;
  SInt val;
  int *end;
  int *cur_1;
  undefined1 local_70 [4];
  SInt prevVal_1;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  counts;
  size_t commonCount;
  SInt commonValue;
  char *output_local;
  size_t numInts_local;
  int *begin_local;
  
  if (numInts == 0) {
    begin_local = (int *)0x0;
  }
  else {
    commonCount._4_4_ = 0;
    counts._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ::std::
    unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::unordered_map((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                     *)local_70);
    cur_1._4_4_ = 0;
    piStack_88 = begin + numInts;
    for (end = begin; end != piStack_88; end = end + 1) {
      tVar1 = _Signed<int>(*end);
      count._4_4_ = tVar1 - cur_1._4_4_;
      pmVar2 = ::std::
               unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
               ::operator[]((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                             *)local_70,(key_type *)((long)&count + 4));
      p = (char *)(*pmVar2 + 1);
      *pmVar2 = (mapped_type)p;
      if (counts._M_h._M_single_bucket < p) {
        commonCount._4_4_ = count._4_4_;
        counts._M_h._M_single_bucket = (__node_base_ptr)p;
      }
      else if (((__node_base_ptr)p == counts._M_h._M_single_bucket) &&
              (commonCount._4_4_ < count._4_4_)) {
        commonCount._4_4_ = count._4_4_;
      }
      cur_1._4_4_ = _Signed<int>(*end);
    }
    ::std::
    unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                      *)local_70);
    vintsOut = _WriteBits<int>(output,commonCount._4_4_);
    cur = (int *)(vintsOut + (numInts * 2 + 7 >> 3));
    local_bc = 0;
    piStack_b8 = begin;
    codesOut = vintsOut;
    for (output_local = (char *)numInts; (char *)0x3 < output_local;
        output_local = output_local + -4) {
      (anonymous_namespace)::_EncodeNHelper<4,int_const*>
                (&stack0xffffffffffffff48,commonCount._4_4_,&local_bc,&vintsOut,(char **)&cur);
    }
    switch(output_local) {
    case (char *)0x0:
      break;
    case (char *)0x1:
      (anonymous_namespace)::_EncodeNHelper<1,int_const*>
                (&stack0xffffffffffffff48,commonCount._4_4_,&local_bc,&vintsOut,(char **)&cur);
      break;
    case (char *)0x2:
      (anonymous_namespace)::_EncodeNHelper<2,int_const*>
                (&stack0xffffffffffffff48,commonCount._4_4_,&local_bc,&vintsOut,(char **)&cur);
      break;
    case (char *)0x3:
      (anonymous_namespace)::_EncodeNHelper<3,int_const*>
                (&stack0xffffffffffffff48,commonCount._4_4_,&local_bc,&vintsOut,(char **)&cur);
    }
    begin_local = (int *)((long)cur - (long)output);
  }
  return (size_t)begin_local;
}

Assistant:

size_t
_EncodeIntegers(Int const *begin, size_t numInts, char *output)
{
    using SInt = typename std::make_signed<Int>::type;
    
    if (numInts == 0)
        return 0;

    // First find the most common element value.
    SInt commonValue = 0;
    {
        size_t commonCount = 0;
        std::unordered_map<SInt, size_t> counts;
        SInt prevVal = 0;
        for (Int const *cur = begin, *end = begin + numInts;
             cur != end; ++cur) {
            SInt val = _Signed(*cur) - prevVal;
            const size_t count = ++counts[val];
            if (count > commonCount) {
                commonValue = val;
                commonCount = count;
            } else if (count == commonCount && val > commonValue) {
                // Take the largest common value in case of a tie -- this gives
                // the biggest potential savings in the encoded stream.
                commonValue = val;
            }
            prevVal = _Signed(*cur);
        }
    }

    // Now code the values.
    
    // Write most common value.
    char *p = _WriteBits(output, commonValue);
    char *codesOut = p;
    char *vintsOut = p + (numInts * 2 + 7) / 8;

    Int const *cur = begin;
    SInt prevVal = 0;
    while (numInts >= 4) {
        _EncodeNHelper<4>(cur, commonValue, prevVal, codesOut, vintsOut);
        numInts -= 4;
    }
    switch (numInts) {
    case 0: default: break;
    case 1: _EncodeNHelper<1>(cur, commonValue, prevVal, codesOut, vintsOut);
        break;
    case 2: _EncodeNHelper<2>(cur, commonValue, prevVal, codesOut, vintsOut);
        break;
    case 3: _EncodeNHelper<3>(cur, commonValue, prevVal, codesOut, vintsOut);
        break;
    };
    
    return vintsOut - output;
}